

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O0

int SMPI_Allgatherv(void *sendbuf,int sendcount,SMPI_Datatype sendtype,void *recvbuf,
                   size_t *recvcounts,size_t *displs,SMPI_Datatype recvtype,SMPI_Comm comm)

{
  undefined4 in_EDX;
  int ret;
  SMPI_Datatype in_stack_0000018c;
  size_t *in_stack_00000190;
  size_t *in_stack_00000198;
  void *in_stack_000001a0;
  int in_stack_000001ac;
  unsigned_long *in_stack_000001b0;
  SMPI_Comm in_stack_000001c0;
  int local_2c;
  
  local_2c = 0;
  switch(in_EDX) {
  case 0:
    local_2c = anon_unknown.dwarf_df27d1::SMPI_Allgatherv_Impl<int>
                         ((int *)in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,
                          in_stack_00000198,in_stack_00000190,in_stack_0000018c,in_stack_000001c0);
    break;
  case 1:
    local_2c = anon_unknown.dwarf_df27d1::SMPI_Allgatherv_Impl<long>
                         ((long *)in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,
                          in_stack_00000198,in_stack_00000190,in_stack_0000018c,in_stack_000001c0);
    break;
  case 2:
    local_2c = anon_unknown.dwarf_df27d1::SMPI_Allgatherv_Impl<unsigned_long>
                         (in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,
                          in_stack_00000190,in_stack_0000018c,in_stack_000001c0);
    break;
  case 3:
    local_2c = anon_unknown.dwarf_df27d1::SMPI_Allgatherv_Impl<char>
                         ((char *)in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,
                          in_stack_00000198,in_stack_00000190,in_stack_0000018c,in_stack_000001c0);
    break;
  case 4:
    local_2c = anon_unknown.dwarf_df27d1::SMPI_Allgatherv_Impl<unsigned_char>
                         ((uchar *)in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,
                          in_stack_00000198,in_stack_00000190,in_stack_0000018c,in_stack_000001c0);
  }
  return local_2c;
}

Assistant:

int SMPI_Allgatherv(const void *sendbuf, int sendcount, SMPI_Datatype sendtype, void *recvbuf,
                    const size_t *recvcounts, const size_t *displs, SMPI_Datatype recvtype,
                    SMPI_Comm comm)
{
    int ret = 0;
    switch (sendtype)
    {
#define F(type)                                                                                    \
    ret = SMPI_Allgatherv_Impl(static_cast<const type *>(sendbuf), sendcount, recvbuf, recvcounts, \
                               displs, recvtype, comm)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return ret;
}